

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

DWORD __thiscall TSparseArray::FindGroup_Items0(TSparseArray *this,DWORD index)

{
  uint *puVar1;
  _BASEVALS *p_Var2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  DWORD DVar7;
  
  puVar1 = TGenericArray<unsigned_int>::operator[](&this->IndexToItem0,(ulong)(index >> 9));
  uVar5 = *puVar1 >> 9;
  puVar1 = TGenericArray<unsigned_int>::operator[](&this->IndexToItem0,(ulong)((index >> 9) + 1));
  uVar4 = *puVar1 + 0x1ff >> 9;
  if (uVar4 - uVar5 < 10) {
    DVar7 = uVar5 - 1;
    iVar6 = uVar5 << 9;
    do {
      p_Var2 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)(DVar7 + 2));
      DVar7 = DVar7 + 1;
      iVar6 = iVar6 + 0x200;
    } while (iVar6 - p_Var2->BaseValue200 <= index);
  }
  else {
    while (DVar7 = uVar5, DVar7 + 1 < uVar4) {
      uVar3 = DVar7 + uVar4 >> 1;
      p_Var2 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)uVar4);
      uVar5 = uVar3;
      if (index < uVar4 * 0x200 - p_Var2->BaseValue200) {
        uVar5 = DVar7;
        uVar4 = uVar3;
      }
    }
  }
  return DVar7;
}

Assistant:

DWORD FindGroup_Items0(DWORD index)
    {
        // Setup the group range to search
        DWORD minGroup = (IndexToItem0[INDEX_TO_GROUP(index) + 0]) >> 9;
        DWORD maxGroup = (IndexToItem0[INDEX_TO_GROUP(index) + 1] + 0x1FF) >> 9;

        // Search the groups and find the BASEVALS structure
        // For spans less than 10 groups, use sequential search, otherwise binary search.
        if ((maxGroup - minGroup) < 10)
        {
            // HOTS: 1959CF7
            while (index >= GROUP_TO_INDEX(minGroup) - BaseVals[minGroup + 1].BaseValue200 + 0x200)
            {
                // HOTS: 1959D14
                minGroup++;
            }
        }
        else
        {
            // HOTS: 1959D2E
            while ((minGroup + 1) < maxGroup)
            {
                // HOTS: 1959D38
                DWORD middleValue = (maxGroup + minGroup) >> 1;

                if (index < (maxGroup << 0x09) - BaseVals[maxGroup].BaseValue200)
                {
                    // HOTS: 01959D4B
                    maxGroup = middleValue;
                }
                else
                {
                    // HOTS: 1959D50
                    minGroup = middleValue;
                }
            }
        }

        return minGroup;
    }